

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O2

void cmGlobalNinjaGenerator::WriteVariable
               (ostream *os,string *name,string *value,string *comment,int indent)

{
  ostream *poVar1;
  string val;
  string sStack_48;
  
  if (name->_M_string_length != 0) {
    cmSystemTools::TrimWhitespace(&sStack_48,value);
    if (sStack_48._M_string_length != 0) {
      WriteComment(os,comment);
      Indent(os,indent);
      poVar1 = std::operator<<(os,(string *)name);
      poVar1 = std::operator<<(poVar1," = ");
      poVar1 = std::operator<<(poVar1,(string *)&sStack_48);
      std::operator<<(poVar1,"\n");
    }
    std::__cxx11::string::~string((string *)&sStack_48);
    return;
  }
  cmSystemTools::Error
            ("No name given for WriteVariable! called with comment: ",(comment->_M_dataplus)._M_p,
             (char *)0x0,(char *)0x0);
  return;
}

Assistant:

void cmGlobalNinjaGenerator::WriteVariable(std::ostream& os,
                                           const std::string& name,
                                           const std::string& value,
                                           const std::string& comment,
                                           int indent)
{
  // Make sure we have a name.
  if(name.empty())
    {
    cmSystemTools::Error("No name given for WriteVariable! called "
                         "with comment: ",
                         comment.c_str());
    return;
    }

  // Do not add a variable if the value is empty.
  std::string val = cmSystemTools::TrimWhitespace(value);
  if(val.empty())
    {
    return;
    }

  cmGlobalNinjaGenerator::WriteComment(os, comment);
  cmGlobalNinjaGenerator::Indent(os, indent);
  os << name << " = " << val << "\n";
}